

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects-info.c
# Opt level: O0

_Bool effect_damages(effect *effect)

{
  _Bool _Var1;
  int iVar2;
  char *pcVar3;
  int local_28;
  int i;
  int num_subeffects;
  effect *e;
  effect *effect_local;
  
  if ((effect->index == 1) || (effect->index == 0x6a)) {
    _i = effect->next;
    iVar2 = dice_evaluate(effect->dice,0,AVERAGE,(random_value *)0x0);
    local_28 = 0;
    for (; _i != (effect *)0x0 && local_28 < iVar2; _i = _i->next) {
      _Var1 = effect_damages(_i);
      if (_Var1) {
        return true;
      }
      local_28 = local_28 + 1;
    }
    effect_local._7_1_ = false;
  }
  else {
    pcVar3 = effect_info(effect);
    effect_local._7_1_ = false;
    if (pcVar3 != (char *)0x0) {
      pcVar3 = effect_info(effect);
      iVar2 = strcmp(pcVar3,"dam");
      effect_local._7_1_ = iVar2 == 0;
    }
  }
  return effect_local._7_1_;
}

Assistant:

bool effect_damages(const struct effect *effect)
{
	if (effect->index == EF_RANDOM || effect->index == EF_SELECT) {
		// Random or select effect
		struct effect *e = effect->next;
		int num_subeffects = dice_evaluate(effect->dice, 0, AVERAGE, NULL);

		// Check if any of the subeffects do damage
		for (int i = 0; e != NULL && i < num_subeffects; i++) {
			if (effect_damages(e)) {
				return true;
			}
			e = e->next;
		}
		return false;
	} else {
		// Not a random or select effect, check the info string for
		// damage
		return effect_info(effect) != NULL &&
			streq(effect_info(effect), "dam");
	}
}